

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosDistribution>
::verifyImageData(TestStatus *__return_storage_ptr__,
                 MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosDistribution> *this,
                 VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
                 vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  ulong uVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference v;
  float *pfVar7;
  float fVar8;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  Vector<float,_2> local_1e8;
  Vector<float,_2> local_1e0;
  Vector<float,_2> local_1d8;
  Vec2 distanceFromCenter_1;
  deUint32 sampleNdx_1;
  Vec2 averageSamplePos_1;
  float local_1a0;
  float local_19c;
  deUint32 sampleNdxB;
  deUint32 sampleNdxA;
  undefined1 local_188 [16];
  Vector<float,_2> local_178;
  int local_170;
  allocator<char> local_169;
  string local_168;
  undefined1 local_144 [24];
  deUint32 errorComponent_1;
  deUint32 sampleNdx;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> samplePositions;
  deUint32 x_1;
  deUint32 y_1;
  deUint32 z_1;
  Vector<float,_2> local_dc;
  Vector<float,_2> local_d4;
  Vector<float,_2> local_cc;
  Vec2 distanceFromCenter;
  undefined1 local_b4 [24];
  Vec2 averageSamplePos;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [24];
  deUint32 errorComponent;
  deUint32 x;
  deUint32 y;
  deUint32 z;
  float distanceThreshold;
  float standardDeviation;
  float variance;
  deUint32 numSamples;
  ConstPixelBufferAccess *dataRS_local;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
  *dataPerSample_local;
  VkImageCreateInfo *imageRSInfo_local;
  VkImageCreateInfo *imageMSInfo_local;
  MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosDistribution> *this_local;
  
  standardDeviation = (float)imageMSInfo->samples;
  distanceThreshold = 1.0 / ((float)(uint)standardDeviation * 12.0);
  _variance = dataRS;
  dataRS_local = (ConstPixelBufferAccess *)dataPerSample;
  dataPerSample_local =
       (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
       imageRSInfo;
  imageRSInfo_local = imageMSInfo;
  imageMSInfo_local = (VkImageCreateInfo *)this;
  this_local = (MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosDistribution> *)
               __return_storage_ptr__;
  z = (deUint32)deFloatSqrt(distanceThreshold);
  y = (deUint32)((float)z * 2.0);
  for (x = 0; x < *(uint *)((long)&dataPerSample_local[1].
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 4); x = x + 1) {
    for (errorComponent = 0;
        errorComponent <
        *(uint *)&dataPerSample_local[1].
                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_finish; errorComponent = errorComponent + 1) {
      for (local_68._20_4_ = 0;
          (uint)local_68._20_4_ <
          *(uint *)((long)&dataPerSample_local[1].
                           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start + 4);
          local_68._20_4_ = local_68._20_4_ + 1) {
        tcu::ConstPixelBufferAccess::getPixelUint
                  ((ConstPixelBufferAccess *)local_68,(int)_variance,local_68._20_4_,errorComponent)
        ;
        puVar3 = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)local_68);
        local_68._16_4_ = *puVar3;
        if (local_68._16_4_ != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,"gl_SamplePosition is not within interval [0,1]",&local_89)
          ;
          tcu::TestStatus::fail(__return_storage_ptr__,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::allocator<char>::~allocator(&local_89);
          return __return_storage_ptr__;
        }
        if (3 < (uint)standardDeviation) {
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_b4,(int)_variance,local_68._20_4_,
                     errorComponent);
          puVar3 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_b4);
          uVar1 = *puVar3;
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)&distanceFromCenter,(int)_variance,local_68._20_4_,
                     errorComponent);
          puVar3 = tcu::Vector<unsigned_int,_4>::y((Vector<unsigned_int,_4> *)&distanceFromCenter);
          tcu::Vector<float,_2>::Vector
                    ((Vector<float,_2> *)(local_b4 + 0x10),(float)uVar1 / 255.0,
                     (float)*puVar3 / 255.0);
          tcu::Vector<float,_2>::Vector(&local_dc,0.5,0.5);
          tcu::operator-((tcu *)&local_d4,(Vector<float,_2> *)(local_b4 + 0x10),&local_dc);
          tcu::abs<float,2>((tcu *)&local_cc,&local_d4);
          fVar8 = tcu::Vector<float,_2>::x(&local_cc);
          if (((float)y < fVar8) || (fVar8 = tcu::Vector<float,_2>::y(&local_cc), (float)y < fVar8))
          {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&z_1,
                       "Sample positions are not uniformly distributed within the pixel",
                       (allocator<char> *)((long)&y_1 + 3));
            tcu::TestStatus::fail(__return_storage_ptr__,(string *)&z_1);
            std::__cxx11::string::~string((string *)&z_1);
            std::allocator<char>::~allocator((allocator<char> *)((long)&y_1 + 3));
            return __return_storage_ptr__;
          }
        }
      }
    }
  }
  x_1 = 0;
  do {
    if ((imageRSInfo_local->extent).depth <= x_1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"Passed",&local_231);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator(&local_231);
      return __return_storage_ptr__;
    }
    for (samplePositions.
         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        samplePositions.
        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ < (imageRSInfo_local->extent).height;
        samplePositions.
        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             samplePositions.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      for (samplePositions.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          (uint)samplePositions.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage <
          (imageRSInfo_local->extent).width;
          samplePositions.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)samplePositions.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
        uVar4 = (ulong)(uint)standardDeviation;
        std::allocator<tcu::Vector<float,_2>_>::allocator
                  ((allocator<tcu::Vector<float,_2>_> *)((long)&errorComponent_1 + 3));
        std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
                  ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                   &sampleNdx,uVar4,
                   (allocator<tcu::Vector<float,_2>_> *)((long)&errorComponent_1 + 3));
        std::allocator<tcu::Vector<float,_2>_>::~allocator
                  ((allocator<tcu::Vector<float,_2>_> *)((long)&errorComponent_1 + 3));
        for (local_144._20_4_ = 0.0; (uint)local_144._20_4_ < (uint)standardDeviation;
            local_144._20_4_ = local_144._20_4_ + 1) {
          pvVar5 = std::
                   vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ::operator[]((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 *)dataRS_local,(ulong)(uint)local_144._20_4_);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_144,(int)pvVar5,
                     (uint)samplePositions.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     samplePositions.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          puVar3 = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)local_144);
          local_144._16_4_ = *puVar3;
          if (local_144._16_4_ != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_168,"gl_SamplePosition is not within interval [0,1]",
                       &local_169);
            tcu::TestStatus::fail(__return_storage_ptr__,&local_168);
            std::__cxx11::string::~string((string *)&local_168);
            std::allocator<char>::~allocator(&local_169);
            local_170 = 1;
            goto LAB_009384d1;
          }
          pvVar5 = std::
                   vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ::operator[]((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 *)dataRS_local,(ulong)(uint)local_144._20_4_);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_188,(int)pvVar5,
                     (uint)samplePositions.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     samplePositions.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          puVar3 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_188);
          uVar1 = *puVar3;
          pvVar5 = std::
                   vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ::operator[]((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 *)dataRS_local,(ulong)(uint)local_144._20_4_);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)&sampleNdxB,(int)pvVar5,
                     (uint)samplePositions.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     samplePositions.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          puVar3 = tcu::Vector<unsigned_int,_4>::y((Vector<unsigned_int,_4> *)&sampleNdxB);
          tcu::Vector<float,_2>::Vector(&local_178,(float)uVar1 / 255.0,(float)*puVar3 / 255.0);
          pvVar6 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                   operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                               *)&sampleNdx,(ulong)(uint)local_144._20_4_);
          *&pvVar6->m_data = local_178.m_data;
        }
        for (local_19c = 0.0; local_1a0 = local_19c, (uint)local_19c < (uint)standardDeviation;
            local_19c = (float)((int)local_19c + 1)) {
          while (local_1a0 = (float)((int)local_1a0 + 1), (uint)local_1a0 < (uint)standardDeviation)
          {
            pvVar6 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                     operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 *)&sampleNdx,(ulong)(uint)local_19c);
            v = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *
                           )&sampleNdx,(ulong)(uint)local_1a0);
            bVar2 = tcu::Vector<float,_2>::operator==(pvVar6,v);
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)(averageSamplePos_1.m_data + 1),
                         "Two samples have the same position",
                         (allocator<char> *)((long)averageSamplePos_1.m_data + 3));
              tcu::TestStatus::fail
                        (__return_storage_ptr__,(string *)(averageSamplePos_1.m_data + 1));
              std::__cxx11::string::~string((string *)(averageSamplePos_1.m_data + 1));
              std::allocator<char>::~allocator
                        ((allocator<char> *)((long)averageSamplePos_1.m_data + 3));
              local_170 = 1;
              goto LAB_009384d1;
            }
          }
        }
        if ((uint)standardDeviation < 4) {
LAB_009384c7:
          local_170 = 0;
        }
        else {
          tcu::Vector<float,_2>::Vector
                    ((Vector<float,_2> *)(distanceFromCenter_1.m_data + 1),0.0,0.0);
          for (distanceFromCenter_1.m_data[0] = 0.0;
              (uint)distanceFromCenter_1.m_data[0] < (uint)standardDeviation;
              distanceFromCenter_1.m_data[0] = (float)((int)distanceFromCenter_1.m_data[0] + 1)) {
            pvVar6 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                     operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 *)&sampleNdx,(ulong)(uint)distanceFromCenter_1.m_data[0]);
            pfVar7 = tcu::Vector<float,_2>::x(pvVar6);
            fVar8 = *pfVar7;
            pfVar7 = tcu::Vector<float,_2>::x((Vector<float,_2> *)(distanceFromCenter_1.m_data + 1))
            ;
            *pfVar7 = *pfVar7 + fVar8;
            pvVar6 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                     operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 *)&sampleNdx,(ulong)(uint)distanceFromCenter_1.m_data[0]);
            pfVar7 = tcu::Vector<float,_2>::y(pvVar6);
            fVar8 = *pfVar7;
            pfVar7 = tcu::Vector<float,_2>::y((Vector<float,_2> *)(distanceFromCenter_1.m_data + 1))
            ;
            *pfVar7 = fVar8 + *pfVar7;
          }
          uVar4 = (ulong)(uint)standardDeviation;
          pfVar7 = tcu::Vector<float,_2>::x((Vector<float,_2> *)(distanceFromCenter_1.m_data + 1));
          *pfVar7 = *pfVar7 / (float)uVar4;
          uVar4 = (ulong)(uint)standardDeviation;
          pfVar7 = tcu::Vector<float,_2>::y((Vector<float,_2> *)(distanceFromCenter_1.m_data + 1));
          *pfVar7 = *pfVar7 / (float)uVar4;
          tcu::Vector<float,_2>::Vector(&local_1e8,0.5,0.5);
          tcu::operator-((tcu *)&local_1e0,(Vector<float,_2> *)(distanceFromCenter_1.m_data + 1),
                         &local_1e8);
          tcu::abs<float,2>((tcu *)&local_1d8,&local_1e0);
          fVar8 = tcu::Vector<float,_2>::x(&local_1d8);
          if ((fVar8 <= (float)y) &&
             (fVar8 = tcu::Vector<float,_2>::y(&local_1d8), fVar8 <= (float)y)) goto LAB_009384c7;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_208,
                     "Sample positions are not uniformly distributed within the pixel",&local_209);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          std::allocator<char>::~allocator(&local_209);
          local_170 = 1;
        }
LAB_009384d1:
        std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
                  ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                   &sampleNdx);
        if (local_170 != 0) {
          return __return_storage_ptr__;
        }
      }
    }
    x_1 = x_1 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSamplePosDistribution>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																						 const vk::VkImageCreateInfo&						imageRSInfo,
																						 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																						 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	const deUint32 numSamples = static_cast<deUint32>(imageMSInfo.samples);

	// approximate Bates distribution as normal
	const float variance = (1.0f / (12.0f * (float)numSamples));
	const float standardDeviation = deFloatSqrt(variance);

	// 95% of means of sample positions are within 2 standard deviations if
	// they were randomly assigned. Sample patterns are expected to be more
	// uniform than a random pattern.
	const float distanceThreshold = 2.0f * standardDeviation;

	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;  ++x)
	{
		const deUint32 errorComponent = dataRS.getPixelUint(x, y, z).z();

		if (errorComponent > 0)
			return tcu::TestStatus::fail("gl_SamplePosition is not within interval [0,1]");

		if (numSamples >= VK_SAMPLE_COUNT_4_BIT)
		{
			const tcu::Vec2 averageSamplePos	= tcu::Vec2((float)dataRS.getPixelUint(x, y, z).x() / 255.0f, (float)dataRS.getPixelUint(x, y, z).y() / 255.0f);
			const tcu::Vec2	distanceFromCenter	= tcu::abs(averageSamplePos - tcu::Vec2(0.5f, 0.5f));

			if (distanceFromCenter.x() > distanceThreshold || distanceFromCenter.y() > distanceThreshold)
				return tcu::TestStatus::fail("Sample positions are not uniformly distributed within the pixel");
		}
	}

	for (deUint32 z = 0u; z < imageMSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageMSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageMSInfo.extent.width;  ++x)
	{
		std::vector<tcu::Vec2> samplePositions(numSamples);

		for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
		{
			const deUint32 errorComponent = dataPerSample[sampleNdx].getPixelUint(x, y, z).z();

			if (errorComponent > 0)
				return tcu::TestStatus::fail("gl_SamplePosition is not within interval [0,1]");

			samplePositions[sampleNdx] = tcu::Vec2( (float)dataPerSample[sampleNdx].getPixelUint(x, y, z).x() / 255.0f,
													(float)dataPerSample[sampleNdx].getPixelUint(x, y, z).y() / 255.0f);
		}

		for (deUint32 sampleNdxA = 0u;				sampleNdxA < numSamples; ++sampleNdxA)
		for (deUint32 sampleNdxB = sampleNdxA + 1u; sampleNdxB < numSamples; ++sampleNdxB)
		{
			if (samplePositions[sampleNdxA] == samplePositions[sampleNdxB])
				return tcu::TestStatus::fail("Two samples have the same position");
		}

		if (numSamples >= VK_SAMPLE_COUNT_4_BIT)
		{
			tcu::Vec2 averageSamplePos(0.0f, 0.0f);

			for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
			{
				averageSamplePos.x() += samplePositions[sampleNdx].x();
				averageSamplePos.y() += samplePositions[sampleNdx].y();
			}

			averageSamplePos.x() /= (float)numSamples;
			averageSamplePos.y() /= (float)numSamples;

			const tcu::Vec2	distanceFromCenter = tcu::abs(averageSamplePos - tcu::Vec2(0.5f, 0.5f));

			if (distanceFromCenter.x() > distanceThreshold || distanceFromCenter.y() > distanceThreshold)
				return tcu::TestStatus::fail("Sample positions are not uniformly distributed within the pixel");
		}
	}

	return tcu::TestStatus::pass("Passed");
}